

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O0

size_t Fossilize::compute_size_varint(uint32_t *words,size_t word_count)

{
  uint uVar1;
  ulong uStack_28;
  uint32_t w;
  size_t i;
  size_t size;
  size_t word_count_local;
  uint32_t *words_local;
  
  i = 0;
  for (uStack_28 = 0; uStack_28 < word_count; uStack_28 = uStack_28 + 1) {
    uVar1 = words[uStack_28];
    if (uVar1 < 0x80) {
      i = i + 1;
    }
    else if (uVar1 < 0x4000) {
      i = i + 2;
    }
    else if (uVar1 < 0x200000) {
      i = i + 3;
    }
    else if (uVar1 < 0x10000000) {
      i = i + 4;
    }
    else {
      i = i + 5;
    }
  }
  return i;
}

Assistant:

size_t compute_size_varint(const uint32_t *words, size_t word_count)
{
	size_t size = 0;
	for (size_t i = 0; i < word_count; i++)
	{
		auto w = words[i];
		if (w < (1u << 7))
			size += 1;
		else if (w < (1u << 14))
			size += 2;
		else if (w < (1u << 21))
			size += 3;
		else if (w < (1u << 28))
			size += 4;
		else
			size += 5;
	}
	return size;
}